

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkAllocVecArray(int count,N_Vector tmpl,N_Vector **v,sunindextype lrw1,long *lrw,
                    sunindextype liw1,long *liw)

{
  long lVar1;
  long in_RCX;
  long *in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  long *in_R8;
  long in_R9;
  
  if (*in_RDX == 0) {
    lVar1 = N_VCloneVectorArray(in_EDI,in_RSI);
    *in_RDX = lVar1;
    if (*in_RDX == 0) {
      return 0;
    }
    *in_R8 = in_EDI * in_RCX + *in_R8;
    *(long *)liw1 = in_EDI * in_R9 + *(long *)liw1;
  }
  return 1;
}

Assistant:

sunbooleantype arkAllocVecArray(int count, N_Vector tmpl, N_Vector** v,
                                sunindextype lrw1, long int* lrw,
                                sunindextype liw1, long int* liw)
{
  /* allocate the new vector array if necessary */
  if (*v == NULL)
  {
    *v = N_VCloneVectorArray(count, tmpl);
    if (*v == NULL) { return (SUNFALSE); }
    *lrw += count * lrw1;
    *liw += count * liw1;
  }
  return (SUNTRUE);
}